

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestServer.hpp
# Opt level: O0

void __thiscall
test_server::TestServer::TestServer
          (TestServer *this,
          initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *args)

{
  ostream *poVar1;
  child *this_00;
  char (*in_RCX) [2];
  child *process;
  undefined1 local_38 [8];
  string stringized;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *args_local;
  TestServer *this_local;
  
  stringized.field_2._8_8_ = args;
  std::unique_ptr<boost::process::child,std::default_delete<boost::process::child>>::
  unique_ptr<std::default_delete<boost::process::child>,void>
            ((unique_ptr<boost::process::child,std::default_delete<boost::process::child>> *)this);
  boost::algorithm::join<std::initializer_list<std::__cxx11::string>,char[2]>
            ((type *)local_38,(algorithm *)stringized.field_2._8_8_,
             (initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x2cc4d9,in_RCX);
  poVar1 = std::operator<<((ostream *)&std::cout,"going to fork to start: ");
  poVar1 = std::operator<<(poVar1,(string *)local_38);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  this_00 = (child *)operator_new(0x20);
  boost::process::child::child<std::__cxx11::string&>
            (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::unique_ptr<boost::process::child,_std::default_delete<boost::process::child>_>::reset
            (&this->child,this_00);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

TestServer(std::initializer_list<std::string> &&args) {
        std::string stringized = boost::algorithm::join(args, " ");
        std::cout << "going to fork to start: " << stringized << std::endl;
        auto process = new boost::process::child(stringized);
        child.reset(process);
    }